

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_union_ref_t *
flatcc_builder_union_vector_push(flatcc_builder_t *B,flatcc_builder_union_ref_t uref)

{
  flatbuffers_uoffset_t fVar1;
  uint uVar2;
  __flatcc_builder_frame_t *p_Var3;
  uint8_t *puVar4;
  int iVar5;
  
  p_Var3 = B->frame;
  if (p_Var3->type != 7) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_union_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x6b2,
                  "flatcc_builder_union_ref_t *flatcc_builder_union_vector_push(flatcc_builder_t *, flatcc_builder_union_ref_t)"
                 );
  }
  fVar1 = (p_Var3->container).table.pl_end;
  if (fVar1 != 0x1fffffff) {
    (p_Var3->container).table.pl_end = fVar1 + 1;
    uVar2 = B->ds_offset;
    B->ds_offset = uVar2 + 8;
    if (((uVar2 + 8 < B->ds_limit) ||
        (iVar5 = reserve_ds(B,(ulong)(uVar2 + 9),0xfffffffc), iVar5 == 0)) &&
       (puVar4 = B->ds, puVar4 != (uint8_t *)0x0)) {
      *(flatcc_builder_union_ref_t *)(puVar4 + uVar2) = uref;
      return (flatcc_builder_union_ref_t *)(puVar4 + uVar2);
    }
  }
  return (flatcc_builder_union_ref_t *)0x0;
}

Assistant:

flatcc_builder_union_ref_t *flatcc_builder_union_vector_push(flatcc_builder_t *B,
        flatcc_builder_union_ref_t uref)
{
    flatcc_builder_union_ref_t *p;

    check(frame(type) == flatcc_builder_union_vector, "expected union vector frame");
    if (frame(container.vector.count) == max_union_count) {
        return 0;
    }
    frame(container.vector.count) += 1;
    if (0 == (p = push_ds(B, union_size))) {
        return 0;
    }
    *p = uref;
    return p;
}